

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseNumberExpression(Parser *this)

{
  NumericConstant *pNVar1;
  NumberExpression *this_00;
  Parser *in_RSI;
  NumericConstant local_70;
  unique_ptr<NumberExpression,_std::default_delete<NumberExpression>_> local_50 [3];
  undefined1 local_38 [8];
  NumericConstant value;
  Parser *this_local;
  
  pNVar1 = Token::numericValue(&in_RSI->mCurrentToken);
  NumericConstant::NumericConstant((NumericConstant *)local_38,pNVar1);
  nextToken(in_RSI);
  this_00 = (NumberExpression *)operator_new(0x28);
  NumericConstant::NumericConstant(&local_70,(NumericConstant *)local_38);
  NumberExpression::NumberExpression(this_00,&local_70);
  std::unique_ptr<NumberExpression,std::default_delete<NumberExpression>>::
  unique_ptr<std::default_delete<NumberExpression>,void>
            ((unique_ptr<NumberExpression,std::default_delete<NumberExpression>> *)local_50,this_00)
  ;
  std::unique_ptr<Expression,std::default_delete<Expression>>::
  unique_ptr<NumberExpression,std::default_delete<NumberExpression>,void>
            ((unique_ptr<Expression,std::default_delete<Expression>> *)this,local_50);
  std::unique_ptr<NumberExpression,_std::default_delete<NumberExpression>_>::~unique_ptr(local_50);
  NumericConstant::~NumericConstant(&local_70);
  NumericConstant::~NumericConstant((NumericConstant *)local_38);
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseNumberExpression() {
	auto value = mCurrentToken.numericValue();
	nextToken(); //Consume the number
	return std::unique_ptr<NumberExpression>(new NumberExpression(value));
}